

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::rescaleVar(Projection *this,MultiFab *sig,int param_2,MultiFab *vel,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pGVar4;
  bool bVar5;
  long lVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  MFIter mfi;
  Box local_114;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  Array4<double> local_d0;
  MFIter local_90;
  long lVar18;
  
  pGVar4 = (this->parent->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = *(int *)((long)(pGVar4 + level) + 0xac);
  iVar2 = *(int *)((long)(pGVar4 + level) + 0xb0);
  iVar3 = *(int *)((long)(pGVar4 + level) + 0xbc);
  iVar10 = *(int *)((long)(pGVar4 + level) + 0xb8);
  amrex::MFIter::MFIter(&local_90,(FabArrayBase *)sig,true);
  if (local_90.currentIndex < local_90.endIndex) {
    auVar14._0_8_ = (long)iVar1;
    auVar14._8_4_ = iVar1;
    auVar14._12_4_ = iVar1 >> 0x1f;
    auVar12._0_8_ = (long)iVar10;
    auVar12._8_4_ = iVar10;
    auVar12._12_4_ = iVar10 >> 0x1f;
    local_e8 = auVar14 ^ _DAT_007890c0;
    local_f8 = auVar12 ^ _DAT_007890c0;
    do {
      amrex::MFIter::growntilebox(&local_114,&local_90,-1000000);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&sig->super_FabArray<amrex::FArrayBox>,&local_90);
      auVar7 = _DAT_007890c0;
      auVar14 = _DAT_0077bb40;
      auVar12 = _DAT_0077bb30;
      if (local_114.smallend.vect[2] <= local_114.bigend.vect[2]) {
        uVar9 = local_114.bigend.vect[0] - local_114.smallend.vect[0];
        auVar19._0_8_ = (long)local_114.smallend.vect[0];
        auVar19._8_4_ = local_114.smallend.vect[0];
        auVar19._12_4_ = local_114.smallend.vect[0] >> 0x1f;
        auVar13._0_8_ = auVar19._0_8_ + (long)DAT_0077bb30;
        auVar13._8_8_ = auVar19._8_8_ + DAT_0077bb30._8_8_;
        auVar15._4_4_ = 0;
        auVar15._0_4_ = uVar9;
        auVar15._8_4_ = uVar9;
        auVar15._12_4_ = 0;
        auVar15 = auVar15 ^ _DAT_0077bb40;
        iVar1 = local_114.smallend.vect[2];
        do {
          if (local_114.smallend.vect[1] <= local_114.bigend.vect[1]) {
            iVar10 = local_114.smallend.vect[1];
            do {
              if (local_114.smallend.vect[0] <= local_114.bigend.vect[0]) {
                lVar6 = ((long)iVar10 - (long)local_d0.begin.y) * local_d0.jstride * 8 +
                        ((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                        (long)local_114.smallend.vect[0] * 8 + (long)local_d0.begin.x * -8;
                bVar11 = iVar3 < iVar10;
                bVar5 = iVar10 < iVar2;
                auVar16._9_7_ = 0;
                auVar16._0_9_ = CONCAT18(bVar11,(ulong)bVar11) | CONCAT18(bVar5,(ulong)bVar5);
                uVar8 = 0;
                auVar17 = auVar13;
                do {
                  auVar36._8_4_ = (int)uVar8;
                  auVar36._0_8_ = uVar8;
                  auVar36._12_4_ = (int)(uVar8 >> 0x20);
                  auVar19 = (auVar36 | auVar12) ^ auVar14;
                  iVar21 = -(uint)(auVar15._0_4_ < auVar19._0_4_);
                  iVar23 = -(uint)(auVar15._4_4_ < auVar19._4_4_);
                  iVar24 = -(uint)(auVar15._8_4_ < auVar19._8_4_);
                  iVar25 = -(uint)(auVar15._12_4_ < auVar19._12_4_);
                  auVar26._4_4_ = iVar21;
                  auVar26._0_4_ = iVar21;
                  auVar26._8_4_ = iVar24;
                  auVar26._12_4_ = iVar24;
                  iVar21 = -(uint)(auVar19._4_4_ == auVar15._4_4_);
                  iVar24 = -(uint)(auVar19._12_4_ == auVar15._12_4_);
                  auVar31._4_4_ = iVar21;
                  auVar31._0_4_ = iVar21;
                  auVar31._8_4_ = iVar24;
                  auVar31._12_4_ = iVar24;
                  auVar20._4_4_ = iVar23;
                  auVar20._0_4_ = iVar23;
                  auVar20._8_4_ = iVar25;
                  auVar20._12_4_ = iVar25;
                  auVar20 = auVar20 | auVar31 & auVar26;
                  auVar19 = auVar17 ^ auVar7;
                  iVar23 = -(uint)(auVar19._0_4_ < (int)local_e8._0_4_);
                  iVar21 = auVar19._4_4_;
                  auVar27._4_4_ = -(uint)(iVar21 < (int)local_e8._4_4_);
                  iVar25 = -(uint)(auVar19._8_4_ < (int)local_e8._8_4_);
                  iVar24 = auVar19._12_4_;
                  auVar27._12_4_ = -(uint)(iVar24 < (int)local_e8._12_4_);
                  auVar32._4_4_ = iVar23;
                  auVar32._0_4_ = iVar23;
                  auVar32._8_4_ = iVar25;
                  auVar32._12_4_ = iVar25;
                  auVar34._4_4_ = -(uint)(local_e8._4_4_ == iVar21);
                  auVar34._12_4_ = -(uint)(local_e8._12_4_ == iVar24);
                  auVar34._0_4_ = auVar34._4_4_;
                  auVar34._8_4_ = auVar34._12_4_;
                  auVar27._0_4_ = auVar27._4_4_;
                  auVar27._8_4_ = auVar27._12_4_;
                  auVar33._0_4_ = -(uint)((int)local_f8._0_4_ < auVar19._0_4_);
                  auVar33._4_4_ = -(uint)((int)local_f8._4_4_ < iVar21);
                  auVar33._8_4_ = -(uint)((int)local_f8._8_4_ < auVar19._8_4_);
                  auVar33._12_4_ = -(uint)((int)local_f8._12_4_ < iVar24);
                  auVar35._4_4_ = auVar33._0_4_;
                  auVar35._0_4_ = auVar33._0_4_;
                  auVar35._8_4_ = auVar33._8_4_;
                  auVar35._12_4_ = auVar33._8_4_;
                  auVar37._4_4_ = -(uint)(iVar21 == local_f8._4_4_);
                  auVar37._0_4_ = -(uint)(iVar21 == local_f8._4_4_);
                  auVar37._8_4_ = -(uint)(iVar24 == local_f8._12_4_);
                  auVar37._12_4_ = -(uint)(iVar24 == local_f8._12_4_);
                  auVar22._4_4_ = auVar33._4_4_;
                  auVar22._0_4_ = auVar33._4_4_;
                  auVar22._8_4_ = auVar33._12_4_;
                  auVar22._12_4_ = auVar33._12_4_;
                  auVar19 = auVar22 | auVar37 & auVar35 | auVar27 | auVar34 & auVar32 | auVar16;
                  auVar28._8_4_ = 0xffffffff;
                  auVar28._0_8_ = 0xffffffffffffffff;
                  auVar28._12_4_ = 0xffffffff;
                  auVar28 = (auVar20 | auVar19) ^ auVar28;
                  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = *(ulong *)((long)local_d0.p + uVar8 * 8 + lVar6);
                  }
                  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    auVar33._8_8_ = *(undefined8 *)((long)local_d0.p + uVar8 * 8 + lVar6 + 8);
                  }
                  auVar29._8_8_ = -(ulong)(ABS(auVar33._8_8_) <= 1e-200);
                  auVar29._0_8_ = -(ulong)(ABS(auVar33._0_8_) <= 1e-200);
                  auVar29 = auVar28 & auVar29;
                  if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined8 *)((long)local_d0.p + uVar8 * 8 + lVar6) = 0;
                  }
                  if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined8 *)((long)local_d0.p + uVar8 * 8 + lVar6 + 8) = 0;
                  }
                  auVar36 = divpd(_DAT_0078ba10,auVar33);
                  auVar30._0_4_ = (auVar29._0_4_ << 0x1f) >> 0x1f;
                  auVar30._4_4_ = (auVar29._0_4_ << 0x1f) >> 0x1f;
                  auVar30._8_4_ = (auVar29._8_4_ << 0x1f) >> 0x1f;
                  auVar30._12_4_ = (auVar29._8_4_ << 0x1f) >> 0x1f;
                  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(long *)((long)local_d0.p + uVar8 * 8 + lVar6) = SUB168(~auVar30 & auVar36,0);
                  }
                  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(long *)((long)local_d0.p + uVar8 * 8 + lVar6 + 8) =
                         SUB168(~auVar30 & auVar36,8);
                  }
                  auVar19 = ~auVar20 & auVar19;
                  if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined8 *)((long)local_d0.p + uVar8 * 8 + lVar6) = 0x6974e718d7d7625a;
                  }
                  if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined8 *)((long)local_d0.p + uVar8 * 8 + lVar6 + 8) = 0x6974e718d7d7625a;
                  }
                  uVar8 = uVar8 + 2;
                  lVar18 = auVar17._8_8_;
                  auVar17._0_8_ = auVar17._0_8_ + 2;
                  auVar17._8_8_ = lVar18 + 2;
                } while (((ulong)uVar9 + 2 & 0xfffffffffffffffe) != uVar8);
              }
              bVar11 = iVar10 != local_114.bigend.vect[1];
              iVar10 = iVar10 + 1;
            } while (bVar11);
          }
          bVar11 = iVar1 != local_114.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar11);
      }
      amrex::MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  amrex::MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
Projection::rescaleVar (MultiFab*       sig,
                        int             /*sig_nghosts*/,
                        MultiFab*       vel,
                        int             level)
{
    AMREX_ASSERT(sig->nComp() == 1);
    AMREX_ASSERT(vel->nComp() >= AMREX_SPACEDIM);

    const Box& domain  = parent->Geom(level).Domain();
    const int  domlox  = domain.smallEnd(0);
    const int  domloy  = domain.smallEnd(1);
    const int  domhix  = domain.bigEnd(0);
    const int  domhiy  = domain.bigEnd(1);

#if (AMREX_SPACEDIM  == 2)

    if (parent->Geom(0).IsRZ())
    {
        //
        // Divide sigma and vel by a radius for r-z coordinates.
        // Invert sigma to return to original form
        //
	const Real dxr     = parent->Geom(level).CellSize()[0];

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // Don't think we need this check for small sigma since RZ
	      // doesn't work with EB in MLNodeLap. The concern is covered vals == 0
	      // if ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue ) ?
	      sigarr(i,j,k) = (static_cast<Real>(i)+ Real(0.5))*dxr/sigarr(i,j,k);
	      // : sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to bogus_value
	      sigarr(i,j,k) = BogusValue;
	    }
	  });

	  auto const& velarr = vel->array(mfi);

	  amrex::ParallelFor(bx, AMREX_SPACEDIM, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      velarr(i,j,k,n) /= (static_cast<Real>(i)+ Real(0.5))*dxr;
	    }
	    else
	    {
	      // set vals outside the domain
	      velarr(i,j,k,n) = BogusValue;
	    }
	  });
	}
    }
    else
#endif
    {
        //
        // Invert sigma
        //
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
	for (MFIter mfi(*sig,TilingIfNotGPU()); mfi.isValid(); ++mfi)
	{
	  const Box& bx = mfi.growntilebox();
	  auto const& sigarr = sig->array(mfi);

	  amrex::ParallelFor(bx, [=]
	  AMREX_GPU_DEVICE (int i, int j, int k) noexcept
	  {
	    if ( i >= domlox && i <= domhix &&
		 j >= domloy && j <= domhiy)
	    {
	      // The conern here is EB covered cells set to zero
	      sigarr(i,j,k) = ( amrex::Math::abs(sigarr(i,j,k)) > SmallValue )
		? Real(1.0)/sigarr(i,j,k)
		: sigarr(i,j,k) = 0.;
	    }
	    else
	    {
	      // set vals outside the domain to
	      sigarr(i,j,k) = BogusValue;
	    }
	  });
	}
    }
}